

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O3

void __thiscall
btMultiBody::calcAccelerationDeltasMultiDof
          (btMultiBody *this,btScalar *force,btScalar *output,btAlignedObjectArray<float> *scratch_r
          ,btAlignedObjectArray<btVector3> *scratch_v)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  float *ptr;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  btVector3 bVar13;
  uint uVar14;
  long lVar15;
  float *pfVar16;
  btVector3 *pbVar17;
  btMultibodyLink *pbVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  btSpatialForceVector *pbVar23;
  int *piVar24;
  long lVar25;
  int dof2;
  int iVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  btSpatialMotionVector *outVec;
  float fVar31;
  btScalar bVar32;
  float fVar33;
  btScalar bVar34;
  float fVar35;
  float fVar36;
  undefined8 uVar37;
  btSpatialForceVector *local_b0;
  btMatrix3x3 *local_a8;
  btVector3 *local_98;
  float *local_90;
  btSpatialForceVector *local_80;
  float *local_78;
  btSpatialForceVector local_50;
  
  iVar7 = (this->m_links).m_size;
  lVar15 = (long)iVar7;
  iVar30 = this->m_dofCount;
  uVar14 = scratch_r->m_size;
  if ((int)uVar14 < iVar30) {
    lVar19 = (long)(int)uVar14;
    if (scratch_r->m_capacity < iVar30) {
      if (iVar30 == 0) {
        pfVar16 = (float *)0x0;
      }
      else {
        pfVar16 = (float *)btAlignedAllocInternal((long)iVar30 * 4,0x10);
        uVar14 = scratch_r->m_size;
      }
      ptr = scratch_r->m_data;
      if ((int)uVar14 < 1) {
        if (ptr != (float *)0x0) goto LAB_001b82a9;
      }
      else {
        uVar20 = 0;
        do {
          pfVar16[uVar20] = ptr[uVar20];
          uVar20 = uVar20 + 1;
        } while (uVar14 != uVar20);
LAB_001b82a9:
        if (scratch_r->m_ownsMemory == true) {
          btAlignedFreeInternal(ptr);
        }
      }
      scratch_r->m_ownsMemory = true;
      scratch_r->m_data = pfVar16;
      scratch_r->m_capacity = iVar30;
    }
    else {
      pfVar16 = scratch_r->m_data;
    }
    memset(pfVar16 + lVar19,0,(iVar30 - lVar19) * 4);
  }
  scratch_r->m_size = iVar30;
  lVar19 = lVar15 * 4 + 4;
  uVar14 = scratch_v->m_size;
  iVar30 = (int)lVar19;
  if (((int)uVar14 < iVar30) && (scratch_v->m_capacity < iVar30)) {
    if (iVar30 == 0) {
      pbVar17 = (btVector3 *)0x0;
    }
    else {
      pbVar17 = (btVector3 *)btAlignedAllocInternal(lVar19 * 0x10,0x10);
      uVar14 = scratch_v->m_size;
    }
    if (0 < (int)uVar14) {
      lVar19 = 0;
      do {
        puVar1 = (undefined8 *)((long)scratch_v->m_data->m_floats + lVar19);
        uVar37 = puVar1[1];
        puVar2 = (undefined8 *)((long)pbVar17->m_floats + lVar19);
        *puVar2 = *puVar1;
        puVar2[1] = uVar37;
        lVar19 = lVar19 + 0x10;
      } while ((ulong)uVar14 << 4 != lVar19);
    }
    if ((scratch_v->m_data != (btVector3 *)0x0) && (scratch_v->m_ownsMemory == true)) {
      btAlignedFreeInternal(scratch_v->m_data);
    }
    scratch_v->m_ownsMemory = true;
    scratch_v->m_data = pbVar17;
    scratch_v->m_capacity = iVar30;
  }
  scratch_v->m_size = iVar30;
  uVar14 = this->m_dofCount;
  if ((ulong)uVar14 == 0) {
    local_b0 = (btSpatialForceVector *)scratch_v->m_data;
    local_80 = local_b0 + lVar15;
    local_a8 = (this->m_matrixBuf).m_data;
    local_78 = (float *)0x0;
  }
  else {
    local_78 = scratch_r->m_data;
    local_b0 = (btSpatialForceVector *)scratch_v->m_data;
    local_80 = local_b0 + lVar15;
    local_a8 = (this->m_matrixBuf).m_data;
    if (0 < (int)uVar14) {
      local_98 = (this->m_vectorBuf).m_data;
      local_90 = (this->m_realBuf).m_data + (ulong)uVar14 + 6;
      goto LAB_001b8421;
    }
  }
  local_98 = (btVector3 *)0x0;
  local_90 = (float *)0x0;
LAB_001b8421:
  if (calcAccelerationDeltasMultiDof(float_const*,float*,btAlignedObjectArray<float>&,btAlignedObjectArray<btVector3>&)
      ::result == '\0') {
    calcAccelerationDeltasMultiDof();
  }
  if (calcAccelerationDeltasMultiDof(float_const*,float*,btAlignedObjectArray<float>&,btAlignedObjectArray<btVector3>&)
      ::spatForceVecTemps == '\0') {
    calcAccelerationDeltasMultiDof();
  }
  if (calcAccelerationDeltasMultiDof(float_const*,float*,btAlignedObjectArray<float>&,btAlignedObjectArray<btVector3>&)
      ::fromParent == '\0') {
    calcAccelerationDeltasMultiDof();
  }
  if (this->m_fixedBase == true) {
    (local_b0->m_bottomVec).m_floats[0] = 0.0;
    (local_b0->m_bottomVec).m_floats[1] = 0.0;
    (local_b0->m_bottomVec).m_floats[2] = 0.0;
    (local_b0->m_bottomVec).m_floats[3] = 0.0;
    (local_b0->m_topVec).m_floats[0] = 0.0;
    (local_b0->m_topVec).m_floats[1] = 0.0;
    (local_b0->m_topVec).m_floats[2] = 0.0;
    (local_b0->m_topVec).m_floats[3] = 0.0;
  }
  else {
    calcAccelerationDeltasMultiDof::fromParent.m_rotMat.m_el[0].m_floats =
         *&local_a8->m_el[0].m_floats;
    calcAccelerationDeltasMultiDof::fromParent.m_rotMat.m_el[1].m_floats =
         *&local_a8->m_el[1].m_floats;
    calcAccelerationDeltasMultiDof::fromParent.m_rotMat.m_el[2].m_floats =
         *&local_a8->m_el[2].m_floats;
    local_50.m_bottomVec.m_floats[2] = -force[2];
    local_50.m_topVec.m_floats[2] = -force[5];
    local_50.m_bottomVec.m_floats._0_8_ = *(ulong *)force ^ 0x8000000080000000;
    local_50.m_bottomVec.m_floats[3] = 0.0;
    local_50.m_topVec.m_floats._0_8_ = *(ulong *)(force + 3) ^ 0x8000000080000000;
    local_50.m_topVec.m_floats[3] = 0.0;
    btSpatialTransformationMatrix::transformRotationOnly<btSpatialForceVector>
              (&calcAccelerationDeltasMultiDof::fromParent,&local_50,local_b0,None);
  }
  if (0 < iVar7) {
    memset(local_b0 + 1,0,lVar15 << 5);
    lVar29 = lVar15 * 600 + -0x1b8;
    lVar19 = lVar15;
    do {
      lVar22 = lVar19 + -1;
      pbVar18 = (this->m_links).m_data;
      piVar24 = &pbVar18[lVar22].m_dofOffset;
      iVar30 = pbVar18[lVar22].m_parent;
      calcAccelerationDeltasMultiDof::fromParent.m_rotMat.m_el[0].m_floats =
           *&local_a8[lVar19].m_el[0].m_floats;
      calcAccelerationDeltasMultiDof::fromParent.m_rotMat.m_el[1].m_floats =
           *&local_a8[lVar19].m_el[1].m_floats;
      calcAccelerationDeltasMultiDof::fromParent.m_rotMat.m_el[2].m_floats =
           *&local_a8[lVar19].m_el[2].m_floats;
      calcAccelerationDeltasMultiDof::fromParent.m_trnVec.m_floats =
           *&pbVar18[lVar22].m_cachedRVector.m_floats;
      iVar8 = pbVar18[lVar22].m_dofCount;
      lVar21 = (long)iVar8;
      if (0 < lVar21) {
        iVar9 = *piVar24;
        pbVar23 = local_b0 + lVar19;
        iVar26 = iVar9 + 6;
        lVar28 = 0;
        do {
          *(float *)((long)local_78 + lVar28 + (long)iVar9 * 4) =
               force[iVar26] -
               ((pbVar23->m_bottomVec).m_floats[2] *
                *(float *)((long)(pbVar18->m_inertiaLocal).m_floats + lVar28 * 8 + lVar29 + -0x14) +
                (pbVar23->m_bottomVec).m_floats[0] *
                *(float *)((long)(pbVar18->m_inertiaLocal).m_floats + lVar28 * 8 + lVar29 + -0x1c) +
                (pbVar23->m_bottomVec).m_floats[1] *
                *(float *)((long)(pbVar18->m_inertiaLocal).m_floats + lVar28 * 8 + lVar29 + -0x18) +
               (pbVar23->m_topVec).m_floats[2] *
               *(float *)((long)(pbVar18->m_inertiaLocal).m_floats + lVar28 * 8 + lVar29 + -4) +
               (pbVar23->m_topVec).m_floats[0] *
               *(float *)((long)(pbVar18->m_inertiaLocal).m_floats + lVar28 * 8 + lVar29 + -0xc) +
               (pbVar23->m_topVec).m_floats[1] *
               *(float *)((long)(pbVar18->m_inertiaLocal).m_floats + lVar28 * 8 + lVar29 + -8));
          iVar26 = iVar26 + 1;
          lVar28 = lVar28 + 4;
        } while (lVar21 * 4 - lVar28 != 0);
        piVar24 = &pbVar18[lVar22].m_dofOffset;
        if (0 < iVar8) {
          pfVar16 = local_90 + (uint)(iVar9 * iVar9);
          lVar28 = 0;
          do {
            calcAccelerationDeltasMultiDof::invD_times_Y[lVar28] = 0.0;
            fVar31 = 0.0;
            lVar27 = 0;
            do {
              fVar31 = fVar31 + pfVar16[lVar27] * local_78[iVar9 + lVar27];
              lVar27 = lVar27 + 1;
            } while (lVar21 != lVar27);
            calcAccelerationDeltasMultiDof::invD_times_Y[lVar28] = fVar31;
            lVar28 = lVar28 + 1;
            pfVar16 = pfVar16 + lVar21;
          } while (lVar28 != lVar21);
        }
      }
      calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_topVec.m_floats =
           *&local_b0[lVar19].m_topVec.m_floats;
      calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_bottomVec.m_floats =
           *&local_b0[lVar19].m_bottomVec.m_floats;
      if (0 < (long)pbVar18[lVar22].m_dofCount) {
        fVar31 = calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_bottomVec.m_floats[0];
        fVar33 = calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_bottomVec.m_floats[1];
        lVar21 = (long)*piVar24;
        lVar28 = 0;
        bVar32 = calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_bottomVec.m_floats[2];
        bVar34 = calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_topVec.m_floats[2];
        uVar37 = calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_topVec.m_floats._0_8_;
        do {
          bVar13.m_floats =
               calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_bottomVec.m_floats;
          fVar35 = *(float *)((long)calcAccelerationDeltasMultiDof::invD_times_Y + lVar28);
          bVar32 = bVar32 + local_98[lVar21 * 2 + 1].m_floats[lVar28 * 2 + 2] * fVar35;
          bVar34 = bVar34 + local_98[lVar21 * 2].m_floats[lVar28 * 2 + 2] * fVar35;
          fVar36 = SUB84(uVar37,4);
          uVar37._0_4_ = (float)uVar37 +
                         (float)*(undefined8 *)(local_98[lVar21 * 2].m_floats + lVar28 * 2) * fVar35
          ;
          uVar37._4_4_ = fVar36 + (float)((ulong)*(undefined8 *)
                                                  (local_98[lVar21 * 2].m_floats + lVar28 * 2) >>
                                         0x20) * fVar35;
          fVar31 = fVar31 + (float)*(undefined8 *)(local_98[lVar21 * 2 + 1].m_floats + lVar28 * 2) *
                            fVar35;
          fVar33 = fVar33 + (float)((ulong)*(undefined8 *)
                                            (local_98[lVar21 * 2 + 1].m_floats + lVar28 * 2) >> 0x20
                                   ) * fVar35;
          calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_topVec.m_floats[2] = bVar34;
          calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_topVec.m_floats[0] = (float)uVar37;
          calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_topVec.m_floats[1] = uVar37._4_4_;
          calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_bottomVec.m_floats[1] = fVar33;
          calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_bottomVec.m_floats[0] = fVar31;
          calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_bottomVec.m_floats[3] =
               bVar13.m_floats[3];
          calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_bottomVec.m_floats[2] = bVar32;
          lVar28 = lVar28 + 4;
        } while ((long)pbVar18[lVar22].m_dofCount * 4 != lVar28);
      }
      btSpatialTransformationMatrix::transformInverse<btSpatialForceVector>
                (&calcAccelerationDeltasMultiDof::fromParent,
                 calcAccelerationDeltasMultiDof::spatForceVecTemps,
                 calcAccelerationDeltasMultiDof::spatForceVecTemps + 1,None);
      btSpatialForceVector::operator+=
                (local_b0 + 1 + iVar30,calcAccelerationDeltasMultiDof::spatForceVecTemps + 1);
      lVar29 = lVar29 + -600;
      bVar10 = 1 < lVar19;
      lVar19 = lVar22;
    } while (bVar10);
  }
  pbVar23 = local_80 + 1;
  if (this->m_fixedBase == false) {
    solveImatrix(this,local_b0,&calcAccelerationDeltasMultiDof::result);
    uVar37 = calcAccelerationDeltasMultiDof::result.m_bottomVec.m_floats._0_8_;
    fVar31 = -calcAccelerationDeltasMultiDof::result.m_topVec.m_floats[0];
    fVar33 = -calcAccelerationDeltasMultiDof::result.m_topVec.m_floats[1];
    bVar32 = -calcAccelerationDeltasMultiDof::result.m_topVec.m_floats[2];
    bVar34 = -calcAccelerationDeltasMultiDof::result.m_bottomVec.m_floats[2];
    auVar11._8_4_ = bVar32;
    auVar11._0_8_ =
         calcAccelerationDeltasMultiDof::result.m_topVec.m_floats._0_8_ ^ 0x8000000080000000;
    auVar11._12_4_ = 0;
    *(undefined1 (*) [16])local_80[1].m_topVec.m_floats = auVar11;
    auVar12._8_4_ = bVar34;
    auVar12._0_8_ = uVar37 ^ 0x8000000080000000;
    auVar12._12_4_ = 0;
    *(undefined1 (*) [16])local_80[1].m_bottomVec.m_floats = auVar12;
  }
  else {
    fVar31 = 0.0;
    fVar33 = 0.0;
    local_80[1].m_bottomVec.m_floats[0] = 0.0;
    local_80[1].m_bottomVec.m_floats[1] = 0.0;
    local_80[1].m_bottomVec.m_floats[2] = 0.0;
    local_80[1].m_bottomVec.m_floats[3] = 0.0;
    (pbVar23->m_topVec).m_floats[0] = 0.0;
    (pbVar23->m_topVec).m_floats[1] = 0.0;
    local_80[1].m_topVec.m_floats[2] = 0.0;
    local_80[1].m_topVec.m_floats[3] = 0.0;
    bVar32 = 0.0;
  }
  if (0 < iVar7) {
    pbVar18 = (this->m_links).m_data;
    lVar29 = 0xa0;
    lVar19 = 0;
    do {
      lVar21 = lVar19 + 1;
      calcAccelerationDeltasMultiDof::fromParent.m_rotMat.m_el[0].m_floats =
           *&local_a8[lVar21].m_el[0].m_floats;
      calcAccelerationDeltasMultiDof::fromParent.m_rotMat.m_el[1].m_floats =
           *&local_a8[lVar21].m_el[1].m_floats;
      calcAccelerationDeltasMultiDof::fromParent.m_rotMat.m_el[2].m_floats =
           *&local_a8[lVar21].m_el[2].m_floats;
      calcAccelerationDeltasMultiDof::fromParent.m_trnVec.m_floats =
           *&pbVar18[lVar19].m_cachedRVector.m_floats;
      outVec = (btSpatialMotionVector *)(pbVar23 + lVar21);
      btSpatialTransformationMatrix::transform<btSpatialMotionVector>
                (&calcAccelerationDeltasMultiDof::fromParent,
                 (btSpatialMotionVector *)(local_80 + (long)pbVar18[lVar19].m_parent + 2),outVec,
                 None);
      pbVar18 = (this->m_links).m_data;
      iVar7 = pbVar18[lVar19].m_dofCount;
      lVar22 = (long)iVar7;
      if (0 < lVar22) {
        iVar30 = pbVar18[lVar19].m_dofOffset;
        lVar28 = (long)iVar30;
        fVar31 = (outVec->m_bottomVec).m_floats[1];
        fVar33 = (outVec->m_topVec).m_floats[0];
        fVar35 = (outVec->m_topVec).m_floats[1];
        fVar36 = (outVec->m_topVec).m_floats[2];
        fVar3 = (outVec->m_bottomVec).m_floats[0];
        fVar4 = (outVec->m_bottomVec).m_floats[2];
        lVar19 = lVar22 * 4;
        lVar27 = 0;
        do {
          *(float *)((long)calcAccelerationDeltasMultiDof::Y_minus_hT_a + lVar27) =
               *(float *)((long)local_78 + lVar27 + lVar28 * 4) -
               (local_98[lVar28 * 2 + 1].m_floats[lVar27 * 2 + 2] * fVar36 +
                local_98[lVar28 * 2 + 1].m_floats[lVar27 * 2] * fVar33 +
                local_98[lVar28 * 2 + 1].m_floats[lVar27 * 2 + 1] * fVar35 +
               local_98[lVar28 * 2].m_floats[lVar27 * 2 + 2] * fVar4 +
               local_98[lVar28 * 2].m_floats[lVar27 * 2] * fVar3 +
               local_98[lVar28 * 2].m_floats[lVar27 * 2 + 1] * fVar31);
          lVar27 = lVar27 + 4;
        } while (lVar19 - lVar27 != 0);
        if (0 < iVar7) {
          pfVar16 = local_90 + (uint)(iVar30 * iVar30);
          lVar27 = 0;
          do {
            output[lVar28 + lVar27 + 6] = 0.0;
            fVar31 = 0.0;
            lVar25 = 0;
            do {
              fVar31 = fVar31 + *(float *)((long)pfVar16 + lVar25) *
                                *(float *)((long)calcAccelerationDeltasMultiDof::Y_minus_hT_a +
                                          lVar25);
              output[lVar28 + lVar27 + 6] = fVar31;
              lVar25 = lVar25 + 4;
            } while (lVar19 - lVar25 != 0);
            lVar27 = lVar27 + 1;
            pfVar16 = pfVar16 + lVar22;
          } while (lVar27 != lVar22);
          if (0 < iVar7) {
            uVar37 = *(undefined8 *)(outVec->m_topVec).m_floats;
            fVar31 = (float)uVar37;
            fVar33 = (float)((ulong)uVar37 >> 0x20);
            bVar32 = (outVec->m_topVec).m_floats[2];
            uVar37 = *(undefined8 *)(outVec->m_bottomVec).m_floats;
            fVar35 = (float)uVar37;
            fVar36 = (float)((ulong)uVar37 >> 0x20);
            bVar34 = (outVec->m_bottomVec).m_floats[2];
            lVar22 = 0;
            do {
              fVar3 = *(float *)((long)output + lVar22 + lVar28 * 4 + 0x18);
              bVar32 = bVar32 + *(float *)((long)(pbVar18->m_inertiaLocal).m_floats +
                                          lVar22 * 8 + lVar29 + -0x14) * fVar3;
              bVar34 = bVar34 + *(float *)((long)(pbVar18->m_inertiaLocal).m_floats +
                                          lVar22 * 8 + lVar29 + -4) * fVar3;
              uVar37 = *(undefined8 *)
                        ((long)(pbVar18->m_inertiaLocal).m_floats + lVar22 * 8 + lVar29 + -0x1c);
              uVar5 = *(undefined8 *)
                       ((long)(pbVar18->m_inertiaLocal).m_floats + lVar22 * 8 + lVar29 + -0xc);
              fVar31 = fVar31 + (float)uVar37 * fVar3;
              fVar33 = fVar33 + (float)((ulong)uVar37 >> 0x20) * fVar3;
              fVar35 = fVar35 + (float)uVar5 * fVar3;
              fVar36 = fVar36 + (float)((ulong)uVar5 >> 0x20) * fVar3;
              *(ulong *)(outVec->m_topVec).m_floats = CONCAT44(fVar33,fVar31);
              (outVec->m_topVec).m_floats[2] = bVar32;
              *(ulong *)(outVec->m_bottomVec).m_floats = CONCAT44(fVar36,fVar35);
              (outVec->m_bottomVec).m_floats[2] = bVar34;
              lVar22 = lVar22 + 4;
            } while (lVar19 - lVar22 != 0);
          }
        }
      }
      lVar29 = lVar29 + 600;
      lVar19 = lVar21;
    } while (lVar21 != lVar15);
    uVar37 = *(undefined8 *)local_80[1].m_topVec.m_floats;
    fVar31 = (float)uVar37;
    fVar33 = (float)((ulong)uVar37 >> 0x20);
    bVar32 = local_80[1].m_topVec.m_floats[2];
  }
  fVar35 = local_a8->m_el[1].m_floats[2];
  fVar36 = local_a8->m_el[0].m_floats[2];
  fVar3 = local_a8->m_el[2].m_floats[2];
  uVar37 = *(undefined8 *)local_a8->m_el[0].m_floats;
  uVar5 = *(undefined8 *)local_a8->m_el[1].m_floats;
  uVar6 = *(undefined8 *)local_a8->m_el[2].m_floats;
  *(ulong *)output =
       CONCAT44(bVar32 * (float)((ulong)uVar6 >> 0x20) +
                fVar31 * (float)((ulong)uVar37 >> 0x20) + (float)((ulong)uVar5 >> 0x20) * fVar33,
                bVar32 * (float)uVar6 + fVar31 * (float)uVar37 + (float)uVar5 * fVar33);
  output[2] = fVar3 * bVar32 + fVar36 * fVar31 + fVar35 * fVar33;
  fVar31 = local_80[1].m_bottomVec.m_floats[0];
  fVar33 = local_80[1].m_bottomVec.m_floats[1];
  fVar35 = local_80[1].m_bottomVec.m_floats[2];
  fVar36 = local_a8->m_el[1].m_floats[2];
  fVar3 = local_a8->m_el[0].m_floats[2];
  fVar4 = local_a8->m_el[2].m_floats[2];
  uVar37 = *(undefined8 *)local_a8->m_el[0].m_floats;
  uVar5 = *(undefined8 *)local_a8->m_el[1].m_floats;
  uVar6 = *(undefined8 *)local_a8->m_el[2].m_floats;
  *(ulong *)(output + 3) =
       CONCAT44(fVar35 * (float)((ulong)uVar6 >> 0x20) +
                fVar31 * (float)((ulong)uVar37 >> 0x20) + fVar33 * (float)((ulong)uVar5 >> 0x20),
                fVar35 * (float)uVar6 + fVar31 * (float)uVar37 + fVar33 * (float)uVar5);
  output[5] = fVar4 * fVar35 + fVar3 * fVar31 + fVar36 * fVar33;
  return;
}

Assistant:

void btMultiBody::calcAccelerationDeltasMultiDof(const btScalar *force, btScalar *output,
                                       btAlignedObjectArray<btScalar> &scratch_r, btAlignedObjectArray<btVector3> &scratch_v) const
{
    // Temporary matrices/vectors -- use scratch space from caller
    // so that we don't have to keep reallocating every frame

	
	int num_links = getNumLinks();	
    scratch_r.resize(m_dofCount);
    scratch_v.resize(4*num_links + 4);	    

    btScalar * r_ptr = m_dofCount ? &scratch_r[0] : 0;
    btVector3 * v_ptr = &scratch_v[0];

    // zhat_i^A (scratch space)
    btSpatialForceVector * zeroAccSpatFrc = (btSpatialForceVector *)v_ptr;
	v_ptr += num_links * 2 + 2;

    // rot_from_parent (cached from calcAccelerations)
    const btMatrix3x3 * rot_from_parent = &m_matrixBuf[0];

    // hhat (cached), accel (scratch)
    // hhat is NOT stored for the base (but ahat is) 
	const btSpatialForceVector * h = (btSpatialForceVector *)(m_dofCount > 0 ? &m_vectorBuf[0] : 0);
	btSpatialMotionVector * spatAcc = (btSpatialMotionVector *)v_ptr;
	v_ptr += num_links * 2 + 2;

    // Y_i (scratch), invD_i (cached)
    const btScalar * invD = m_dofCount > 0 ? &m_realBuf[6 + m_dofCount] : 0;
	btScalar * Y = r_ptr; 
	////////////////
	//aux variables
	static btScalar invD_times_Y[6];							//D^{-1} * Y [dofxdof x dofx1 = dofx1] <=> D^{-1} * u; better moved to buffers since it is recalced in calcAccelerationDeltasMultiDof; num_dof of btScalar would cover all bodies
	static btSpatialMotionVector result;							//holds results of the SolveImatrix op; it is a spatial motion vector (accel)
	static btScalar Y_minus_hT_a[6];							//Y - h^{T} * a; it's dofx1 for each body so a single 6x1 temp is enough	
	static btSpatialForceVector spatForceVecTemps[6];				//6 temporary spatial force vectors
	static btSpatialTransformationMatrix fromParent;	
	/////////////////

    // First 'upward' loop.
    // Combines CompTreeLinkVelocities and InitTreeLinks from Mirtich.
	
	// Fill in zero_acc
    // -- set to force/torque on the base, zero otherwise
    if (m_fixedBase) 
	{
        zeroAccSpatFrc[0].setZero();
    } else 
	{	
		//test forces
		fromParent.m_rotMat = rot_from_parent[0];
		fromParent.transformRotationOnly(btSpatialForceVector(-force[0],-force[1],-force[2], -force[3],-force[4],-force[5]), zeroAccSpatFrc[0]);
    }
    for (int i = 0; i < num_links; ++i) 
	{
		zeroAccSpatFrc[i+1].setZero();
    }    

	// 'Downward' loop.
    // (part of TreeForwardDynamics in Mirtich.)
    for (int i = num_links - 1; i >= 0; --i)
	{
		const int parent = m_links[i].m_parent;
		fromParent.m_rotMat = rot_from_parent[i+1]; fromParent.m_trnVec = m_links[i].m_cachedRVector;

		for(int dof = 0; dof < m_links[i].m_dofCount; ++dof)
		{
			Y[m_links[i].m_dofOffset + dof] = force[6 + m_links[i].m_dofOffset + dof]
											- m_links[i].m_axes[dof].dot(zeroAccSpatFrc[i+1])
											;
		}

		btVector3 in_top, in_bottom, out_top, out_bottom;
		const btScalar *invDi = &invD[m_links[i].m_dofOffset*m_links[i].m_dofOffset];
		
		for(int dof = 0; dof < m_links[i].m_dofCount; ++dof)
		{
			invD_times_Y[dof] = 0.f;

			for(int dof2 = 0; dof2 < m_links[i].m_dofCount; ++dof2)
			{
				invD_times_Y[dof] += invDi[dof * m_links[i].m_dofCount + dof2] * Y[m_links[i].m_dofOffset + dof2];				
			}	
		}
		
		 // Zp += pXi * (Zi + hi*Yi/Di)
		spatForceVecTemps[0] = zeroAccSpatFrc[i+1];

		for(int dof = 0; dof < m_links[i].m_dofCount; ++dof)
		{
			const btSpatialForceVector &hDof = h[m_links[i].m_dofOffset + dof];
			//
			spatForceVecTemps[0] += hDof * invD_times_Y[dof];		
		}
		

		fromParent.transformInverse(spatForceVecTemps[0], spatForceVecTemps[1]);
			
		zeroAccSpatFrc[parent+1] += spatForceVecTemps[1];
    }
	
	// ptr to the joint accel part of the output
    btScalar * joint_accel = output + 6;


    // Second 'upward' loop
    // (part of TreeForwardDynamics in Mirtich)

    if (m_fixedBase) 
	{
        spatAcc[0].setZero();
    } 
	else 
	{
		solveImatrix(zeroAccSpatFrc[0], result);
		spatAcc[0] = -result;

    }
	
    // now do the loop over the m_links
    for (int i = 0; i < num_links; ++i)
	{
        const int parent = m_links[i].m_parent;
		fromParent.m_rotMat = rot_from_parent[i+1]; fromParent.m_trnVec = m_links[i].m_cachedRVector;

		fromParent.transform(spatAcc[parent+1], spatAcc[i+1]);
		
		for(int dof = 0; dof < m_links[i].m_dofCount; ++dof)
		{
			const btSpatialForceVector &hDof = h[m_links[i].m_dofOffset + dof];
			//			
			Y_minus_hT_a[dof] = Y[m_links[i].m_dofOffset + dof] - spatAcc[i+1].dot(hDof);
		}

		const btScalar *invDi = &invD[m_links[i].m_dofOffset*m_links[i].m_dofOffset];
		mulMatrix(const_cast<btScalar*>(invDi), Y_minus_hT_a, m_links[i].m_dofCount, m_links[i].m_dofCount, m_links[i].m_dofCount, 1, &joint_accel[m_links[i].m_dofOffset]);

		for(int dof = 0; dof < m_links[i].m_dofCount; ++dof)		
			spatAcc[i+1] += m_links[i].m_axes[dof] * joint_accel[m_links[i].m_dofOffset + dof];      
    }

    // transform base accelerations back to the world frame.
    btVector3 omegadot_out;
    omegadot_out = rot_from_parent[0].transpose() * spatAcc[0].getAngular();
	output[0] = omegadot_out[0];
	output[1] = omegadot_out[1];
	output[2] = omegadot_out[2];

    btVector3 vdot_out;
    vdot_out = rot_from_parent[0].transpose() * spatAcc[0].getLinear();
	output[3] = vdot_out[0];
	output[4] = vdot_out[1];
	output[5] = vdot_out[2];

	/////////////////
	//printf("delta = [");
	//for(int dof = 0; dof < getNumDofs() + 6; ++dof)
	//	printf("%.2f ", output[dof]);
	//printf("]\n");
	/////////////////
}